

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O3

void __thiscall
Centaurus::NFADepartureSet<char>::add
          (NFADepartureSet<char> *this,Range<char> *r,NFAClosure *closure)

{
  pointer ppVar1;
  bool bVar2;
  pointer this_00;
  CharClass<char> local_50;
  
  this_00 = (this->
            super_vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ).
            super__Vector_base<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->
           super_vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           ).
           super__Vector_base<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != ppVar1) {
    do {
      if ((closure->_M_t)._M_impl.super__Rb_tree_header._M_node_count ==
          (this_00->second)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        bVar2 = std::__equal<false>::
                equal<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>>
                          ((closure->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                           (_Rb_tree_const_iterator<int>)
                           &(closure->_M_t)._M_impl.super__Rb_tree_header,
                           (this_00->second)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
        if (bVar2) {
          CharClass<char>::operator|=(&this_00->first,r);
          return;
        }
      }
      this_00 = this_00 + 1;
    } while (this_00 != ppVar1);
  }
  CharClass<char>::CharClass(&local_50,r);
  std::
  vector<std::pair<Centaurus::CharClass<char>,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<Centaurus::CharClass<char>,std::set<int,std::less<int>,std::allocator<int>>>>>
  ::emplace_back<Centaurus::CharClass<char>,std::set<int,std::less<int>,std::allocator<int>>const&>
            ((vector<std::pair<Centaurus::CharClass<char>,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<Centaurus::CharClass<char>,std::set<int,std::less<int>,std::allocator<int>>>>>
              *)&this->
                 super_vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ,&local_50,closure);
  local_50._vptr_CharClass = (_func_int **)&PTR__CharClass_0019bf68;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
            (&local_50.m_ranges);
  return;
}

Assistant:

void add(const Range<TCHAR>& r, const NFAClosure& closure)
    {
        for (auto& p : *this)
        {
            if (closure.size() == p.second.size() && std::equal(closure.cbegin(), closure.cend(), p.second.cbegin()))
            {
                p.first |= r;
                return;
            }
        }
        this->emplace_back(CharClass<TCHAR>(r), closure);
    }